

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void fmt::v7::format_system_error(buffer<char> *out,int error_code,string_view message)

{
  int iVar1;
  char **in_R8;
  char *system_message;
  memory_buffer buf;
  basic_string_view<char> local_260;
  size_t local_250;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  local_250 = message.size_;
  local_260.size_ = (size_t)message.data_;
  local_248.super_buffer<char>.ptr_ = local_248.store_;
  local_248.super_buffer<char>.size_ = 0;
  local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0073a4b8;
  local_248.super_buffer<char>.capacity_ = 500;
  detail::buffer<char>::try_resize(&local_248.super_buffer<char>,500);
  while( true ) {
    local_260.data_ = local_248.super_buffer<char>.ptr_;
    iVar1 = detail::safe_strerror(error_code,&local_260.data_,local_248.super_buffer<char>.size_);
    if (iVar1 != 0x22) break;
    detail::buffer<char>::try_resize
              (&local_248.super_buffer<char>,local_248.super_buffer<char>.size_ * 2);
  }
  if (iVar1 == 0) {
    format_to<fmt::v7::detail::buffer_appender<char>,char[7],fmt::v7::basic_string_view<char>&,char*&,true>
              ((v7 *)out,(buffer_appender<char>)0x5546a2,(char (*) [7])&local_260.size_,&local_260,
               in_R8);
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(&local_248);
  }
  else {
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(&local_248);
    detail::format_error_code(out,error_code,message);
  }
  return;
}

Assistant:

FMT_FUNC void format_system_error(detail::buffer<char>& out, int error_code,
                                  string_view message) FMT_NOEXCEPT {
  FMT_TRY {
    memory_buffer buf;
    buf.resize(inline_buffer_size);
    for (;;) {
      char* system_message = &buf[0];
      int result =
          detail::safe_strerror(error_code, system_message, buf.size());
      if (result == 0) {
        format_to(detail::buffer_appender<char>(out), "{}: {}", message,
                  system_message);
        return;
      }
      if (result != ERANGE)
        break;  // Can't get error message, report error code instead.
      buf.resize(buf.size() * 2);
    }
  }